

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utrie.cpp
# Opt level: O1

UBool utrie_set32_63(UNewTrie *trie,UChar32 c,uint32_t value)

{
  int iVar1;
  uint uVar2;
  UBool UVar3;
  uint uVar4;
  long lVar5;
  uint32_t *puVar6;
  uint32_t *puVar7;
  uint uVar8;
  
  if (trie == (UNewTrie *)0x0) {
    return '\0';
  }
  UVar3 = '\0';
  if (((uint)c < 0x110000) && (trie->isCompacted == '\0')) {
    uVar2 = trie->index[(uint)c >> 5];
    uVar4 = uVar2;
    if ((long)(int)uVar2 < 1) {
      uVar4 = trie->dataLength;
      iVar1 = uVar4 + 0x20;
      uVar8 = 0xffffffff;
      if (iVar1 <= trie->dataCapacity) {
        trie->dataLength = iVar1;
        uVar8 = uVar4;
      }
      uVar4 = 0xffffffff;
      if (-1 < (int)uVar8) {
        trie->index[(uint)c >> 5] = uVar8;
        puVar6 = trie->data + -(long)(int)uVar2;
        puVar7 = trie->data + uVar8;
        for (lVar5 = 0x20; uVar4 = uVar8, lVar5 != 0; lVar5 = lVar5 + -1) {
          *puVar7 = *puVar6;
          puVar6 = puVar6 + 1;
          puVar7 = puVar7 + 1;
        }
      }
    }
    if ((int)uVar4 < 0) {
      return '\0';
    }
    trie->data[uVar4 + (c & 0x1fU)] = value;
    UVar3 = '\x01';
  }
  return UVar3;
}

Assistant:

U_CAPI UBool U_EXPORT2
utrie_set32(UNewTrie *trie, UChar32 c, uint32_t value) {
    int32_t block;

    /* valid, uncompacted trie and valid c? */
    if(trie==NULL || trie->isCompacted || (uint32_t)c>0x10ffff) {
        return FALSE;
    }

    block=utrie_getDataBlock(trie, c);
    if(block<0) {
        return FALSE;
    }

    trie->data[block+(c&UTRIE_MASK)]=value;
    return TRUE;
}